

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ValueConverter.cpp
# Opt level: O1

size_t __thiscall helics::detail::convertToBinary(detail *this,byte *data,complex<double> val)

{
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  
  *(undefined8 *)this = 0;
  *this = (detail)0x12;
  *(undefined4 *)(this + 3) = 0;
  this[7] = (detail)0x2;
  *(undefined8 *)(this + 8) = in_XMM0_Qa;
  *(undefined8 *)(this + 0x10) = in_XMM1_Qa;
  return 0x18;
}

Assistant:

static inline void addCodeAndSize(std::byte* data, std::byte code, size_t size)
{
    std::memset(data, 0, 8);
    data[0] = code;
    data[3] = littleEndianCode;
    data[4] = static_cast<std::byte>((size >> 24U) & 0xFFU);
    data[5] = static_cast<std::byte>((size >> 16U) & 0xFFU);
    data[6] = static_cast<std::byte>((size >> 8U) & 0xFFU);
    data[7] = static_cast<std::byte>((size & 0xFFU));
}